

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<bool>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,bool *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<bool> local_44;
  optional<bool> local_42 [3];
  undefined1 local_3c [2];
  optional<bool> pv_1;
  optional<bool> pv;
  bool *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (bool *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002ed4a4;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&stack0xffffffffffffffc8,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&stack0xffffffffffffffc8);
  if (bVar1) {
    get_default_value<bool>((PrimVar *)local_3c);
    nonstd::optional_lite::optional<bool>::optional<bool,_0>(&pv_1,(optional<bool> *)local_3c);
    nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)local_3c);
    local_42[1].has_value_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pv_1);
    if (local_42[1].has_value_) {
      pvVar2 = nonstd::optional_lite::optional<bool>::value(&pv_1);
      *v = (bool)(*pvVar2 & 1);
      this_local._7_1_ = 1;
    }
    local_42._3_3_ = 0;
    nonstd::optional_lite::optional<bool>::~optional(&pv_1);
    if (local_42._2_4_ != 0) goto LAB_002ed4a4;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_002ed4a4;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ = tinyusdz::value::TimeSamples::get<bool,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<bool>((PrimVar *)&local_44);
      nonstd::optional_lite::optional<bool>::optional<bool,_0>(local_42,&local_44);
      nonstd::optional_lite::optional<bool>::~optional(&local_44);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_42);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<bool>::value(local_42);
        *v = (bool)(*pvVar2 & 1);
        this_local._7_1_ = 1;
      }
      local_42._3_3_ = 0;
      local_42[1].has_value_ = bVar1;
      nonstd::optional_lite::optional<bool>::~optional(local_42);
      if (local_42._2_4_ != 0) goto LAB_002ed4a4;
    }
    this_local._7_1_ = 0;
  }
LAB_002ed4a4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }